

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O2

void unknown_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,
                    unsigned_short *toLim)

{
  short sVar1;
  unsigned_short **ppuVar3;
  unsigned_short *puVar4;
  byte *pbVar5;
  int iVar2;
  
  ppuVar3 = toP;
  puVar4 = (unsigned_short *)fromLim;
  while ((pbVar5 = (byte *)*fromP, pbVar5 != (byte *)fromLim && (*toP != toLim))) {
    sVar1 = *(short *)((long)enc[3].literalScanners + (ulong)*pbVar5 * 2 + 0x18);
    if (sVar1 == 0) {
      iVar2 = (*enc[3].literalScanners[1])
                        ((ENCODING *)enc[3].sameName,(char *)pbVar5,(char *)puVar4,(char **)ppuVar3)
      ;
      sVar1 = (short)iVar2;
      pbVar5 = (byte *)(*fromP + ((ulong)*(byte *)((long)enc[1].scanners + (ulong)(byte)**fromP) - 3
                                 ));
    }
    else {
      pbVar5 = pbVar5 + 1;
    }
    *fromP = (char *)pbVar5;
    ppuVar3 = (unsigned_short **)*toP;
    puVar4 = (unsigned_short *)((long)ppuVar3 + 2);
    *toP = puVar4;
    *(short *)ppuVar3 = sVar1;
  }
  return;
}

Assistant:

static
void unknown_toUtf16(const ENCODING *enc,
                     const char **fromP, const char *fromLim,
                     unsigned short **toP, const unsigned short *toLim)
{
  while (*fromP != fromLim && *toP != toLim) {
    unsigned short c
      = ((const struct unknown_encoding *)enc)->utf16[(unsigned char)**fromP];
    if (c == 0) {
      c = (unsigned short)((const struct unknown_encoding *)enc)
           ->convert(((const struct unknown_encoding *)enc)->userData, *fromP);
      *fromP += ((const struct normal_encoding *)enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2);
    }
    else
      (*fromP)++;
    *(*toP)++ = c;
  }
}